

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O0

void ucnv_MBCSSingleFromUnicodeWithOffsets(UConverterFromUnicodeArgs *pArgs,UErrorCode *pErrorCode)

{
  byte bVar1;
  UChar UVar2;
  uint16_t *puVar3;
  UBool UVar4;
  UChar *pUVar5;
  ushort local_78;
  UChar trail;
  UBool hasSupplementary;
  uint16_t minValue;
  uint16_t value;
  int32_t nextSourceIndex;
  int32_t sourceIndex;
  UChar32 c;
  uint16_t *results;
  uint16_t *table;
  int32_t *offsets;
  uint8_t *puStack_48;
  int32_t targetCapacity;
  uint8_t *target;
  UChar *sourceLimit;
  UChar *source;
  UConverter *cnv;
  UErrorCode *pErrorCode_local;
  UConverterFromUnicodeArgs *pArgs_local;
  
  source = (UChar *)pArgs->converter;
  sourceLimit = pArgs->source;
  target = (uint8_t *)pArgs->sourceLimit;
  puStack_48 = (uint8_t *)pArgs->target;
  offsets._4_4_ = (int)pArgs->targetLimit - (int)pArgs->target;
  table = (uint16_t *)pArgs->offsets;
  puVar3 = (((UConverter *)source)->sharedData->mbcs).fromUnicodeTable;
  if ((((UConverter *)source)->options & 0x10) == 0) {
    _sourceIndex = (((UConverter *)source)->sharedData->mbcs).fromUnicodeBytes;
  }
  else {
    _sourceIndex = (((UConverter *)source)->sharedData->mbcs).swapLFNLFromUnicodeBytes;
  }
  if (((UConverter *)source)->useFallback == '\0') {
    local_78 = 0xc00;
  }
  else {
    local_78 = 0x800;
  }
  bVar1 = (((UConverter *)source)->sharedData->mbcs).unicodeMask;
  nextSourceIndex = ((UConverter *)source)->fromUChar32;
  _minValue = -1;
  if (nextSourceIndex == 0) {
    _minValue = 0;
  }
  _trail = 0;
  cnv = (UConverter *)pErrorCode;
  pErrorCode_local = (UErrorCode *)pArgs;
  if (nextSourceIndex == 0) goto LAB_0044a050;
  if (offsets._4_4_ < 1) goto LAB_0044a050;
LAB_0044a0a8:
  if (sourceLimit < target) {
    UVar2 = *sourceLimit;
    if ((UVar2 & 0xfc00U) == 0xdc00) {
      sourceLimit = sourceLimit + 1;
      _trail = _trail + 1;
      nextSourceIndex = nextSourceIndex * 0x400 + (uint)(ushort)UVar2 + -0x35fdc00;
      if ((bVar1 & 1) != 0) goto LAB_0044a12c;
      while( true ) {
        *(UChar **)(pErrorCode_local + 4) = sourceLimit;
        nextSourceIndex =
             _extFromU((UConverter *)source,*(UConverterSharedData **)(source + 0x18),
                       nextSourceIndex,&sourceLimit,(UChar *)target,&stack0xffffffffffffffb8,
                       puStack_48 + offsets._4_4_,(int32_t **)&table,_minValue,
                       *(byte *)((long)pErrorCode_local + 2),(UErrorCode *)cnv);
        _trail = (int)((long)sourceLimit - *(undefined8 *)(pErrorCode_local + 4) >> 1) + _trail;
        UVar4 = U_FAILURE(*(UErrorCode *)&cnv->fromUCharErrorBehaviour);
        if (UVar4 != '\0') break;
        offsets._4_4_ = (int)*(undefined8 *)(pErrorCode_local + 10) - (int)puStack_48;
        _minValue = _trail;
LAB_0044a050:
        while( true ) {
          if (target <= sourceLimit) goto LAB_0044a285;
          if (offsets._4_4_ < 1) {
            *(undefined4 *)&cnv->fromUCharErrorBehaviour = 0xf;
            goto LAB_0044a285;
          }
          pUVar5 = sourceLimit + 1;
          UVar2 = *sourceLimit;
          nextSourceIndex = (int32_t)(ushort)UVar2;
          _trail = _trail + 1;
          sourceLimit = pUVar5;
          if ((nextSourceIndex & 0xfffff800U) == 0xd800) {
            if ((UVar2 & 0x400U) == 0) goto LAB_0044a0a8;
            *(undefined4 *)&cnv->fromUCharErrorBehaviour = 0xc;
            goto LAB_0044a285;
          }
LAB_0044a12c:
          if (*(ushort *)
               (_sourceIndex +
               (long)(int)((uint)puVar3[(int)((uint)puVar3[nextSourceIndex >> 10] +
                                             (nextSourceIndex >> 4 & 0x3fU))] +
                          (nextSourceIndex & 0xfU)) * 2) < local_78) break;
          *puStack_48 = (uint8_t)*(ushort *)
                                  (_sourceIndex +
                                  (long)(int)((uint)puVar3[(int)((uint)puVar3[nextSourceIndex >> 10]
                                                                + (nextSourceIndex >> 4 & 0x3fU))] +
                                             (nextSourceIndex & 0xfU)) * 2);
          if (table != (uint16_t *)0x0) {
            *(int *)table = _minValue;
            table = table + 2;
          }
          offsets._4_4_ = offsets._4_4_ + -1;
          nextSourceIndex = 0;
          _minValue = _trail;
          puStack_48 = puStack_48 + 1;
        }
      }
    }
    else {
      *(undefined4 *)&cnv->fromUCharErrorBehaviour = 0xc;
    }
  }
LAB_0044a285:
  *(int32_t *)(source + 0x2a) = nextSourceIndex;
  *(UChar **)(pErrorCode_local + 4) = sourceLimit;
  *(uint8_t **)(pErrorCode_local + 8) = puStack_48;
  *(uint16_t **)(pErrorCode_local + 0xc) = table;
  return;
}

Assistant:

static void
ucnv_MBCSSingleFromUnicodeWithOffsets(UConverterFromUnicodeArgs *pArgs,
                                  UErrorCode *pErrorCode) {
    UConverter *cnv;
    const UChar *source, *sourceLimit;
    uint8_t *target;
    int32_t targetCapacity;
    int32_t *offsets;

    const uint16_t *table;
    const uint16_t *results;

    UChar32 c;

    int32_t sourceIndex, nextSourceIndex;

    uint16_t value, minValue;
    UBool hasSupplementary;

    /* set up the local pointers */
    cnv=pArgs->converter;
    source=pArgs->source;
    sourceLimit=pArgs->sourceLimit;
    target=(uint8_t *)pArgs->target;
    targetCapacity=(int32_t)(pArgs->targetLimit-pArgs->target);
    offsets=pArgs->offsets;

    table=cnv->sharedData->mbcs.fromUnicodeTable;
    if((cnv->options&UCNV_OPTION_SWAP_LFNL)!=0) {
        results=(uint16_t *)cnv->sharedData->mbcs.swapLFNLFromUnicodeBytes;
    } else {
        results=(uint16_t *)cnv->sharedData->mbcs.fromUnicodeBytes;
    }

    if(cnv->useFallback) {
        /* use all roundtrip and fallback results */
        minValue=0x800;
    } else {
        /* use only roundtrips and fallbacks from private-use characters */
        minValue=0xc00;
    }
    hasSupplementary=(UBool)(cnv->sharedData->mbcs.unicodeMask&UCNV_HAS_SUPPLEMENTARY);

    /* get the converter state from UConverter */
    c=cnv->fromUChar32;

    /* sourceIndex=-1 if the current character began in the previous buffer */
    sourceIndex= c==0 ? 0 : -1;
    nextSourceIndex=0;

    /* conversion loop */
    if(c!=0 && targetCapacity>0) {
        goto getTrail;
    }

    while(source<sourceLimit) {
        /*
         * This following test is to see if available input would overflow the output.
         * It does not catch output of more than one byte that
         * overflows as a result of a multi-byte character or callback output
         * from the last source character.
         * Therefore, those situations also test for overflows and will
         * then break the loop, too.
         */
        if(targetCapacity>0) {
            /*
             * Get a correct Unicode code point:
             * a single UChar for a BMP code point or
             * a matched surrogate pair for a "supplementary code point".
             */
            c=*source++;
            ++nextSourceIndex;
            if(U16_IS_SURROGATE(c)) {
                if(U16_IS_SURROGATE_LEAD(c)) {
getTrail:
                    if(source<sourceLimit) {
                        /* test the following code unit */
                        UChar trail=*source;
                        if(U16_IS_TRAIL(trail)) {
                            ++source;
                            ++nextSourceIndex;
                            c=U16_GET_SUPPLEMENTARY(c, trail);
                            if(!hasSupplementary) {
                                /* BMP-only codepages are stored without stage 1 entries for supplementary code points */
                                /* callback(unassigned) */
                                goto unassigned;
                            }
                            /* convert this supplementary code point */
                            /* exit this condition tree */
                        } else {
                            /* this is an unmatched lead code unit (1st surrogate) */
                            /* callback(illegal) */
                            *pErrorCode=U_ILLEGAL_CHAR_FOUND;
                            break;
                        }
                    } else {
                        /* no more input */
                        break;
                    }
                } else {
                    /* this is an unmatched trail code unit (2nd surrogate) */
                    /* callback(illegal) */
                    *pErrorCode=U_ILLEGAL_CHAR_FOUND;
                    break;
                }
            }

            /* convert the Unicode code point in c into codepage bytes */
            value=MBCS_SINGLE_RESULT_FROM_U(table, results, c);

            /* is this code point assigned, or do we use fallbacks? */
            if(value>=minValue) {
                /* assigned, write the output character bytes from value and length */
                /* length==1 */
                /* this is easy because we know that there is enough space */
                *target++=(uint8_t)value;
                if(offsets!=NULL) {
                    *offsets++=sourceIndex;
                }
                --targetCapacity;

                /* normal end of conversion: prepare for a new character */
                c=0;
                sourceIndex=nextSourceIndex;
            } else { /* unassigned */
unassigned:
                /* try an extension mapping */
                pArgs->source=source;
                c=_extFromU(cnv, cnv->sharedData,
                            c, &source, sourceLimit,
                            &target, target+targetCapacity,
                            &offsets, sourceIndex,
                            pArgs->flush,
                            pErrorCode);
                nextSourceIndex+=(int32_t)(source-pArgs->source);

                if(U_FAILURE(*pErrorCode)) {
                    /* not mappable or buffer overflow */
                    break;
                } else {
                    /* a mapping was written to the target, continue */

                    /* recalculate the targetCapacity after an extension mapping */
                    targetCapacity=(int32_t)(pArgs->targetLimit-(char *)target);

                    /* normal end of conversion: prepare for a new character */
                    sourceIndex=nextSourceIndex;
                }
            }
        } else {
            /* target is full */
            *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
            break;
        }
    }

    /* set the converter state back into UConverter */
    cnv->fromUChar32=c;

    /* write back the updated pointers */
    pArgs->source=source;
    pArgs->target=(char *)target;
    pArgs->offsets=offsets;
}